

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv__pipe_getsockpeername(uv_pipe_t *handle,uv__peersockfunc func,char *buffer,size_t *size)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  socklen_t local_a4;
  int err;
  socklen_t addrlen;
  sockaddr_un sa;
  size_t *size_local;
  char *buffer_local;
  uv__peersockfunc func_local;
  uv_pipe_t *handle_local;
  
  local_a4 = 0x6e;
  sa.sun_path._100_8_ = size;
  memset((void *)((long)&err + 2),0,0x6e);
  iVar1 = (*func)((handle->io_watcher).fd,(sockaddr *)((long)&err + 2),&local_a4);
  if (iVar1 < 0) {
    *(undefined8 *)sa.sun_path._100_8_ = 0;
    piVar2 = __errno_location();
    handle_local._4_4_ = -*piVar2;
  }
  else {
    if ((char)addrlen == '\0') {
      local_a4 = local_a4 - 2;
    }
    else {
      sVar3 = strlen((char *)&addrlen);
      local_a4 = (socklen_t)sVar3;
    }
    if ((ulong)local_a4 < *(ulong *)sa.sun_path._100_8_) {
      memcpy(buffer,&addrlen,(ulong)local_a4);
      *(ulong *)sa.sun_path._100_8_ = (ulong)local_a4;
      if (*buffer != '\0') {
        buffer[local_a4] = '\0';
      }
      handle_local._4_4_ = 0;
    }
    else {
      *(ulong *)sa.sun_path._100_8_ = (ulong)(local_a4 + 1);
      handle_local._4_4_ = -0x69;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__pipe_getsockpeername(const uv_pipe_t* handle,
                                    uv__peersockfunc func,
                                    char* buffer,
                                    size_t* size) {
  struct sockaddr_un sa;
  socklen_t addrlen;
  int err;

  addrlen = sizeof(sa);
  memset(&sa, 0, addrlen);
  err = func(uv__stream_fd(handle), (struct sockaddr*) &sa, &addrlen);
  if (err < 0) {
    *size = 0;
    return UV__ERR(errno);
  }

#if defined(__linux__)
  if (sa.sun_path[0] == 0)
    /* Linux abstract namespace */
    addrlen -= offsetof(struct sockaddr_un, sun_path);
  else
#endif
    addrlen = strlen(sa.sun_path);


  if (addrlen >= *size) {
    *size = addrlen + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, sa.sun_path, addrlen);
  *size = addrlen;

  /* only null-terminate if it's not an abstract socket */
  if (buffer[0] != '\0')
    buffer[addrlen] = '\0';

  return 0;
}